

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O3

void Abc_AigDfs_rec(Abc_Obj_t *pNode,Vec_Ptr_t *vNodes)

{
  int iVar1;
  int iVar2;
  Abc_Ntk_t *pAVar3;
  Abc_Ntk_t *pAVar4;
  uint uVar5;
  void **ppvVar6;
  int in_EDX;
  int Fill;
  char *__assertion;
  long lVar7;
  Abc_Obj_t *pNode_00;
  
  pAVar3 = pNode->pNtk;
  iVar1 = pNode->Id;
  Vec_IntFillExtra(&pAVar3->vTravIds,iVar1 + 1,in_EDX);
  if (((long)iVar1 < 0) || ((pAVar3->vTravIds).nSize <= iVar1)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  pAVar4 = pNode->pNtk;
  iVar2 = pAVar4->nTravIds;
  if ((pAVar3->vTravIds).pArray[iVar1] != iVar2) {
    iVar1 = pNode->Id;
    Vec_IntFillExtra(&pAVar4->vTravIds,iVar1 + 1,Fill);
    if (((long)iVar1 < 0) || ((pAVar4->vTravIds).nSize <= iVar1)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    (pAVar4->vTravIds).pArray[iVar1] = iVar2;
    uVar5 = *(uint *)&pNode->field_0x14 & 0xf;
    if ((uVar5 != 2) && (uVar5 != 5)) {
      if (**(int **)((ulong)pNode & 0xfffffffffffffffe) != 3) {
        __assert_fail("Abc_NtkIsStrash(Abc_ObjRegular(pNode)->pNtk)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abc.h"
                      ,0x18e,"int Abc_AigNodeIsConst(Abc_Obj_t *)");
      }
      if ((*(uint *)((long)((ulong)pNode & 0xfffffffffffffffe) + 0x14) & 0xf) != 1) {
        if (uVar5 != 7) {
          __assert_fail("Abc_ObjIsNode( pNode )",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcDfs.c"
                        ,0x496,"void Abc_AigDfs_rec(Abc_Obj_t *, Vec_Ptr_t *)");
        }
        if (0 < (pNode->vFanins).nSize) {
          lVar7 = 0;
          do {
            Abc_AigDfs_rec((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar7]],
                           vNodes);
            lVar7 = lVar7 + 1;
          } while (lVar7 < (pNode->vFanins).nSize);
        }
        if (((ulong)pNode & 1) == 0) {
          if (pNode->pNtk->ntkType == ABC_NTK_STRASH) {
            pNode_00 = (Abc_Obj_t *)(pNode->field_5).pData;
            if ((pNode_00 != (Abc_Obj_t *)0x0) && (0 < (pNode->vFanouts).nSize)) {
              do {
                Abc_AigDfs_rec(pNode_00,vNodes);
                pNode_00 = (Abc_Obj_t *)(pNode_00->field_5).pData;
              } while (pNode_00 != (Abc_Obj_t *)0x0);
            }
            uVar5 = vNodes->nSize;
            if (uVar5 == vNodes->nCap) {
              if ((int)uVar5 < 0x10) {
                if (vNodes->pArray == (void **)0x0) {
                  ppvVar6 = (void **)malloc(0x80);
                }
                else {
                  ppvVar6 = (void **)realloc(vNodes->pArray,0x80);
                }
                vNodes->pArray = ppvVar6;
                vNodes->nCap = 0x10;
              }
              else {
                if (vNodes->pArray == (void **)0x0) {
                  ppvVar6 = (void **)malloc((ulong)uVar5 << 4);
                }
                else {
                  ppvVar6 = (void **)realloc(vNodes->pArray,(ulong)uVar5 << 4);
                }
                vNodes->pArray = ppvVar6;
                vNodes->nCap = uVar5 * 2;
              }
            }
            else {
              ppvVar6 = vNodes->pArray;
            }
            iVar1 = vNodes->nSize;
            vNodes->nSize = iVar1 + 1;
            ppvVar6[iVar1] = pNode;
            return;
          }
          __assertion = "Abc_NtkIsStrash(pNode->pNtk)";
        }
        else {
          __assertion = "!Abc_ObjIsComplement(pNode)";
        }
        __assert_fail(__assertion,
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abc.h"
                      ,400,"int Abc_AigNodeIsChoice(Abc_Obj_t *)");
      }
    }
  }
  return;
}

Assistant:

void Abc_AigDfs_rec( Abc_Obj_t * pNode, Vec_Ptr_t * vNodes )
{
    Abc_Obj_t * pFanin;
    int i;
    // if this node is already visited, skip
    if ( Abc_NodeIsTravIdCurrent( pNode ) )
        return;
    // mark the node as visited
    Abc_NodeSetTravIdCurrent( pNode );
    // skip the PI
    if ( Abc_ObjIsCi(pNode) || Abc_AigNodeIsConst(pNode) )
        return;
    assert( Abc_ObjIsNode( pNode ) );
    // visit the transitive fanin of the node
    Abc_ObjForEachFanin( pNode, pFanin, i )
        Abc_AigDfs_rec( pFanin, vNodes );
    // visit the equivalent nodes
    if ( Abc_AigNodeIsChoice( pNode ) )
        for ( pFanin = (Abc_Obj_t *)pNode->pData; pFanin; pFanin = (Abc_Obj_t *)pFanin->pData )
            Abc_AigDfs_rec( pFanin, vNodes );
    // add the node after the fanins have been added
    Vec_PtrPush( vNodes, pNode );
}